

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedFieldIteratorTest_MutableIteration_Test::TestBody
          (RepeatedFieldIteratorTest_MutableIteration_Test *this)

{
  bool bVar1;
  reference piVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_130;
  Message local_128;
  RepeatedIterator<int> local_120;
  RepeatedIterator<int> local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_d8;
  Message local_d0;
  iterator local_c8;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  Message local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  RepeatedIterator<int> local_70;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_38;
  int local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  iterator iter;
  RepeatedFieldIteratorTest_MutableIteration_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )RepeatedField<int>::begin(&(this->super_RepeatedFieldIteratorTest).proto_array_);
  local_2c = 0;
  piVar2 = internal::RepeatedIterator<int>::operator*((RepeatedIterator<int> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_28,"0","*iter",&local_2c,piVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x4f7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  internal::RepeatedIterator<int>::operator++((RepeatedIterator<int> *)&gtest_ar.message_);
  local_64 = 1;
  local_70.it_ = (pointer)internal::RepeatedIterator<int>::operator++
                                    ((RepeatedIterator<int> *)&gtest_ar.message_,0);
  piVar2 = internal::RepeatedIterator<int>::operator*(&local_70);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_60,"1","*iter++",&local_64,piVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x4f9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_94 = 2;
  piVar2 = internal::RepeatedIterator<int>::operator*((RepeatedIterator<int> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_90,"2","*iter",&local_94,piVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x4fa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  internal::RepeatedIterator<int>::operator++((RepeatedIterator<int> *)&gtest_ar.message_);
  local_c8.it_ = (pointer)RepeatedField<int>::end
                                    (&(this->super_RepeatedFieldIteratorTest).proto_array_);
  local_b9 = internal::operator==(&local_c8,(iterator *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_b8,
               (AssertionResult *)"proto_array_.end() == iter","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x4fc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_10c = 2;
  local_120.it_ =
       (pointer)RepeatedField<int>::end(&(this->super_RepeatedFieldIteratorTest).proto_array_);
  local_118.it_ = (pointer)internal::RepeatedIterator<int>::operator-(&local_120,1);
  piVar2 = internal::RepeatedIterator<int>::operator*(&local_118);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_108,"2","*(proto_array_.end() - 1)",&local_10c,piVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x4fe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  return;
}

Assistant:

TEST_F(RepeatedFieldIteratorTest, MutableIteration) {
  RepeatedField<int>::iterator iter = proto_array_.begin();
  EXPECT_EQ(0, *iter);
  ++iter;
  EXPECT_EQ(1, *iter++);
  EXPECT_EQ(2, *iter);
  ++iter;
  EXPECT_TRUE(proto_array_.end() == iter);

  EXPECT_EQ(2, *(proto_array_.end() - 1));
}